

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::CryptoTest::TestChaCha20
          (CryptoTest *this,string *hex_message,string *hexkey,Nonce96 nonce,uint32_t seek,
          string *hexout)

{
  Span<const_std::byte> key_00;
  Nonce96 nonce_00;
  Span<const_std::byte> s;
  Nonce96 nonce_01;
  Span<const_std::byte> s_00;
  Nonce96 nonce_02;
  Span<const_std::byte> s_01;
  string_view hex_str;
  string_view hex_str_00;
  Span<std::byte> out;
  Span<std::byte> out_00;
  Span<std::byte> output;
  Span<std::byte> output_00;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  vector<std::byte,_std::allocator<std::byte>_> *pvVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 in_R8;
  long in_FS_OFFSET;
  Span<std::byte> SVar6;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_00000008;
  int j;
  size_t pos;
  int i_1;
  size_t i;
  vector<std::byte,_std::allocator<std::byte>_> only_keystream;
  vector<std::byte,_std::allocator<std::byte>_> outres;
  vector<std::byte,_std::allocator<std::byte>_> m;
  vector<std::byte,_std::allocator<std::byte>_> key;
  size_t lens [3];
  ChaCha20 rng;
  char *in_stack_fffffffffffffb18;
  lazy_ostream *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  byte *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffb48;
  lazy_ostream *in_stack_fffffffffffffb50;
  unit_test_log_t *in_stack_fffffffffffffb58;
  ChaCha20 *this_00;
  ChaCha20 *in_stack_fffffffffffffb80;
  undefined6 in_stack_fffffffffffffb88;
  value_type in_stack_fffffffffffffb8e;
  value_type in_stack_fffffffffffffb8f;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 uVar7;
  undefined1 *puVar8;
  byte *in_stack_fffffffffffffbf0;
  byte *in_stack_fffffffffffffbf8;
  byte *in_stack_fffffffffffffc00;
  size_t in_stack_fffffffffffffc08;
  int local_3e4;
  int local_3d8;
  size_type local_3d0;
  undefined1 local_360 [16];
  undefined1 local_350 [112];
  Span<std::byte> local_2e0;
  undefined1 local_2b9;
  undefined8 uStack_2b0;
  undefined1 local_298 [16];
  undefined1 local_288 [120];
  undefined8 uStack_210;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [144];
  undefined8 uStack_150;
  undefined8 uStack_100;
  lazy_ostream local_f8 [2];
  unsigned_long local_d8;
  unsigned_long local_d0;
  long local_c8;
  lazy_ostream local_c0 [2];
  lazy_ostream local_a0 [2];
  undefined1 local_7c [116];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_100 = in_R8;
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb38);
  hex_str._M_str._0_6_ = in_stack_fffffffffffffb88;
  hex_str._M_len = (size_t)in_stack_fffffffffffffb80;
  hex_str._M_str._6_1_ = in_stack_fffffffffffffb8e;
  hex_str._M_str._7_1_ = in_stack_fffffffffffffb8f;
  ParseHex<std::byte>(hex_str);
  sVar3 = std::vector<std::byte,_std::allocator<std::byte>_>::size
                    ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb18);
  if (sVar3 != 0x20) {
    __assert_fail("key.size() == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                  ,0x8d,
                  "void crypto_tests::CryptoTest::TestChaCha20(const std::string &, const std::string &, ChaCha20::Nonce96, uint32_t, const std::string &)"
                 );
  }
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb38);
  hex_str_00._M_str._0_6_ = in_stack_fffffffffffffb88;
  hex_str_00._M_len = (size_t)in_stack_fffffffffffffb80;
  hex_str_00._M_str._6_1_ = in_stack_fffffffffffffb8e;
  hex_str_00._M_str._7_1_ = in_stack_fffffffffffffb8f;
  ParseHex<std::byte>(hex_str_00);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_fffffffffffffb28,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb18);
  puVar8 = local_7c;
  key_00.m_size = (size_t)in_stack_fffffffffffffb38;
  key_00.m_data = in_stack_fffffffffffffb30;
  ChaCha20::ChaCha20((ChaCha20 *)in_stack_fffffffffffffb18,key_00);
  uStack_150 = uStack_100;
  nonce_00._7_1_ = in_stack_fffffffffffffb47;
  nonce_00._0_7_ = in_stack_fffffffffffffb40;
  nonce_00.second = (unsigned_long)in_stack_fffffffffffffb48;
  ChaCha20::Seek((ChaCha20 *)in_stack_fffffffffffffb28,nonce_00,
                 (uint32_t)((ulong)in_stack_fffffffffffffb20 >> 0x20));
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb18);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb18);
  std::vector<std::byte,_std::allocator<std::byte>_>::resize
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb38,
             (size_type)in_stack_fffffffffffffb30);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb18);
  uVar7 = true;
  if (!bVar2) {
    sVar3 = std::vector<std::byte,_std::allocator<std::byte>_>::size
                      ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb18);
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb18);
    uVar7 = sVar3 << 1 == sVar4;
  }
  if ((bool)uVar7 != false) {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb18);
    if (bVar2) {
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffffb28,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                 in_stack_fffffffffffffb18);
      SVar6.m_data._7_1_ = uVar7;
      SVar6.m_data._0_7_ = in_stack_fffffffffffffbd0;
      SVar6.m_size = (size_t)puVar8;
      ChaCha20::Keystream((ChaCha20 *)
                          CONCAT17(in_stack_fffffffffffffb8f,
                                   CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)),
                          SVar6);
    }
    else {
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffffb28,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                 in_stack_fffffffffffffb18);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffffb28,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                 in_stack_fffffffffffffb18);
      input.m_size = in_stack_fffffffffffffc08;
      input.m_data = in_stack_fffffffffffffc00;
      output.m_size = (size_t)in_stack_fffffffffffffbf8;
      output.m_data = in_stack_fffffffffffffbf0;
      ChaCha20::Crypt(in_stack_fffffffffffffb80,input,output);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb28,
                 (pointer)in_stack_fffffffffffffb20,(unsigned_long)in_stack_fffffffffffffb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb18);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffb58,(const_string *)in_stack_fffffffffffffb50,
                 (size_t)in_stack_fffffffffffffb48,
                 (const_string *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffffb20,(char (*) [1])in_stack_fffffffffffffb18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb28,
                 (pointer)in_stack_fffffffffffffb20,(unsigned_long)in_stack_fffffffffffffb18);
      pvVar1 = in_stack_00000008;
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffffb28,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                 in_stack_fffffffffffffb18);
      s.m_data._7_1_ = in_stack_fffffffffffffb47;
      s.m_data._0_7_ = in_stack_fffffffffffffb40;
      s.m_size = (size_t)in_stack_fffffffffffffb48;
      HexStr_abi_cxx11_(s);
      in_stack_fffffffffffffb28 = "HexStr(outres)";
      in_stack_fffffffffffffb20 = local_a0;
      in_stack_fffffffffffffb18 = "hexout";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_1e0,local_1f0,0x9b,1,2,pvVar1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb18);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffb18);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb18);
    if (!bVar2) {
      uStack_210 = uStack_100;
      nonce_01._7_1_ = in_stack_fffffffffffffb47;
      nonce_01._0_7_ = in_stack_fffffffffffffb40;
      nonce_01.second = (unsigned_long)in_stack_fffffffffffffb48;
      ChaCha20::Seek((ChaCha20 *)in_stack_fffffffffffffb28,nonce_01,
                     (uint32_t)((ulong)in_stack_fffffffffffffb20 >> 0x20));
      std::vector<std::byte,_std::allocator<std::byte>_>::size
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb18);
      std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_fffffffffffffb18);
      std::vector<std::byte,_std::allocator<std::byte>_>::vector
                (in_stack_fffffffffffffb48,
                 CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                 (allocator_type *)in_stack_fffffffffffffb38);
      std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_fffffffffffffb18);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffffb28,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                 in_stack_fffffffffffffb18);
      out.m_data._7_1_ = uVar7;
      out.m_data._0_7_ = in_stack_fffffffffffffbd0;
      out.m_size = (size_t)puVar8;
      ChaCha20::Keystream((ChaCha20 *)
                          CONCAT17(in_stack_fffffffffffffb8f,
                                   CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)),
                          out);
      for (local_3d0 = 0;
          sVar3 = std::vector<std::byte,_std::allocator<std::byte>_>::size
                            ((vector<std::byte,_std::allocator<std::byte>_> *)
                             in_stack_fffffffffffffb18), local_3d0 != sVar3;
          local_3d0 = local_3d0 + 1) {
        pvVar5 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                           ((vector<std::byte,_std::allocator<std::byte>_> *)
                            in_stack_fffffffffffffb28,(size_type)in_stack_fffffffffffffb20);
        in_stack_fffffffffffffb8e = *pvVar5;
        pvVar5 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                           ((vector<std::byte,_std::allocator<std::byte>_> *)
                            in_stack_fffffffffffffb28,(size_type)in_stack_fffffffffffffb20);
        in_stack_fffffffffffffb8f = in_stack_fffffffffffffb8e ^ *pvVar5;
        pvVar5 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                           ((vector<std::byte,_std::allocator<std::byte>_> *)
                            in_stack_fffffffffffffb28,(size_type)in_stack_fffffffffffffb20);
        *pvVar5 = in_stack_fffffffffffffb8f;
      }
      do {
        in_stack_fffffffffffffb80 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb28,
                   (pointer)in_stack_fffffffffffffb20,(unsigned_long)in_stack_fffffffffffffb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb18);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffb58,(const_string *)in_stack_fffffffffffffb50,
                   (size_t)in_stack_fffffffffffffb48,
                   (const_string *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffb20,(char (*) [1])in_stack_fffffffffffffb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb28,
                   (pointer)in_stack_fffffffffffffb20,(unsigned_long)in_stack_fffffffffffffb18);
        pvVar1 = in_stack_00000008;
        Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<const_std::byte> *)in_stack_fffffffffffffb28,
                   (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                   in_stack_fffffffffffffb18);
        s_00.m_data._7_1_ = in_stack_fffffffffffffb47;
        s_00.m_data._0_7_ = in_stack_fffffffffffffb40;
        s_00.m_size = (size_t)in_stack_fffffffffffffb48;
        HexStr_abi_cxx11_(s_00);
        in_stack_fffffffffffffb28 = "HexStr(outres)";
        in_stack_fffffffffffffb20 = local_c0;
        in_stack_fffffffffffffb18 = "hexout";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_288,local_298,0xa4,1,2,pvVar1);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb18);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffb18);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb28);
    }
    for (local_3d8 = 0; local_3d8 < 10; local_3d8 = local_3d8 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb18);
      local_d8 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                           ((RandomMixin<FastRandomContext> *)
                            CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                            (unsigned_long)in_stack_fffffffffffffb38);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb18);
      local_d0 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                           ((RandomMixin<FastRandomContext> *)
                            CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                            (unsigned_long)in_stack_fffffffffffffb38);
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb18);
      local_c8 = ((sVar4 >> 1) - local_d8) - local_d0;
      uStack_2b0 = uStack_100;
      nonce_02._7_1_ = in_stack_fffffffffffffb47;
      nonce_02._0_7_ = in_stack_fffffffffffffb40;
      nonce_02.second = (unsigned_long)in_stack_fffffffffffffb48;
      ChaCha20::Seek((ChaCha20 *)in_stack_fffffffffffffb28,nonce_02,
                     (uint32_t)((ulong)in_stack_fffffffffffffb20 >> 0x20));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb18);
      local_2b9 = 0;
      std::vector<std::byte,_std::allocator<std::byte>_>::assign
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb28,
                 (size_type)in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
      for (local_3e4 = 0; local_3e4 < 3; local_3e4 = local_3e4 + 1) {
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffb18);
        if (bVar2) {
          Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                    ((Span<std::byte> *)in_stack_fffffffffffffb28,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                     in_stack_fffffffffffffb18);
          SVar6 = Span<std::byte>::subspan
                            ((Span<std::byte> *)in_stack_fffffffffffffb38,
                             (size_t)in_stack_fffffffffffffb30,(size_t)in_stack_fffffffffffffb28);
          in_stack_fffffffffffffbf8 = SVar6.m_data;
          in_stack_fffffffffffffc00 = (byte *)SVar6.m_size;
          out_00.m_data._7_1_ = uVar7;
          out_00.m_data._0_7_ = in_stack_fffffffffffffbd0;
          out_00.m_size = (size_t)puVar8;
          ChaCha20::Keystream((ChaCha20 *)
                              CONCAT17(in_stack_fffffffffffffb8f,
                                       CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)
                                      ),out_00);
        }
        else {
          Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                    ((Span<std::byte> *)in_stack_fffffffffffffb28,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                     in_stack_fffffffffffffb18);
          local_2e0 = Span<std::byte>::subspan
                                ((Span<std::byte> *)in_stack_fffffffffffffb38,
                                 (size_t)in_stack_fffffffffffffb30,(size_t)in_stack_fffffffffffffb28
                                );
          Span<const_std::byte>::Span<std::byte,_0>
                    ((Span<const_std::byte> *)in_stack_fffffffffffffb18,(Span<std::byte> *)0x58218f)
          ;
          Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                    ((Span<std::byte> *)in_stack_fffffffffffffb28,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                     in_stack_fffffffffffffb18);
          SVar6 = Span<std::byte>::subspan
                            ((Span<std::byte> *)in_stack_fffffffffffffb38,
                             (size_t)in_stack_fffffffffffffb30,(size_t)in_stack_fffffffffffffb28);
          input_00.m_size = (size_t)SVar6.m_data;
          input_00.m_data = in_stack_fffffffffffffc00;
          output_00.m_size = (size_t)in_stack_fffffffffffffbf8;
          output_00.m_data = in_stack_fffffffffffffbf0;
          ChaCha20::Crypt(in_stack_fffffffffffffb80,input_00,output_00);
        }
      }
      do {
        this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb28,
                   (pointer)in_stack_fffffffffffffb20,(unsigned_long)in_stack_fffffffffffffb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb18);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffffb50,
                   (size_t)in_stack_fffffffffffffb48,
                   (const_string *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
        in_stack_fffffffffffffb50 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffb20,(char (*) [1])in_stack_fffffffffffffb18);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb28,
                   (pointer)in_stack_fffffffffffffb20,(unsigned_long)in_stack_fffffffffffffb18);
        in_stack_fffffffffffffb48 = in_stack_00000008;
        Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<const_std::byte> *)in_stack_fffffffffffffb28,
                   (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb20,
                   in_stack_fffffffffffffb18);
        s_01.m_data._7_1_ = in_stack_fffffffffffffb47;
        s_01.m_data._0_7_ = in_stack_fffffffffffffb40;
        s_01.m_size = (size_t)in_stack_fffffffffffffb48;
        HexStr_abi_cxx11_(s_01);
        in_stack_fffffffffffffb28 = "HexStr(outres)";
        in_stack_fffffffffffffb20 = local_f8;
        in_stack_fffffffffffffb18 = "hexout";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_350,local_360,0xb9,1,2,in_stack_fffffffffffffb48);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb18);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffb18);
        in_stack_fffffffffffffb47 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffb47);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb28);
    ChaCha20::~ChaCha20((ChaCha20 *)in_stack_fffffffffffffb28);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb28);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb28);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
      __stack_chk_fail();
    }
    return;
  }
  __assert_fail("hex_message.empty() || m.size() * 2 == hexout.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
                ,0x93,
                "void crypto_tests::CryptoTest::TestChaCha20(const std::string &, const std::string &, ChaCha20::Nonce96, uint32_t, const std::string &)"
               );
}

Assistant:

void TestChaCha20(const std::string &hex_message, const std::string &hexkey, ChaCha20::Nonce96 nonce, uint32_t seek, const std::string& hexout)
{
    auto key = ParseHex<std::byte>(hexkey);
    assert(key.size() == 32);
    auto m = ParseHex<std::byte>(hex_message);
    ChaCha20 rng{key};
    rng.Seek(nonce, seek);
    std::vector<std::byte> outres;
    outres.resize(hexout.size() / 2);
    assert(hex_message.empty() || m.size() * 2 == hexout.size());

    // perform the ChaCha20 round(s), if message is provided it will output the encrypted ciphertext otherwise the keystream
    if (!hex_message.empty()) {
        rng.Crypt(m, outres);
    } else {
        rng.Keystream(outres);
    }
    BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    if (!hex_message.empty()) {
        // Manually XOR with the keystream and compare the output
        rng.Seek(nonce, seek);
        std::vector<std::byte> only_keystream(outres.size());
        rng.Keystream(only_keystream);
        for (size_t i = 0; i != m.size(); i++) {
            outres[i] = m[i] ^ only_keystream[i];
        }
        BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    }

    // Repeat 10x, but fragmented into 3 chunks, to exercise the ChaCha20 class's caching.
    for (int i = 0; i < 10; ++i) {
        size_t lens[3];
        lens[0] = m_rng.randrange(hexout.size() / 2U + 1U);
        lens[1] = m_rng.randrange(hexout.size() / 2U + 1U - lens[0]);
        lens[2] = hexout.size() / 2U - lens[0] - lens[1];

        rng.Seek(nonce, seek);
        outres.assign(hexout.size() / 2U, {});
        size_t pos = 0;
        for (int j = 0; j < 3; ++j) {
            if (!hex_message.empty()) {
                rng.Crypt(Span{m}.subspan(pos, lens[j]), Span{outres}.subspan(pos, lens[j]));
            } else {
                rng.Keystream(Span{outres}.subspan(pos, lens[j]));
            }
            pos += lens[j];
        }
        BOOST_CHECK_EQUAL(hexout, HexStr(outres));
    }
}